

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Statements.cpp
# Opt level: O0

tuple<slang::ast::CaseStatementCondition,_slang::ast::CaseStatementCheck> __thiscall
slang::ast::getConditionAndCheck(ast *this,CaseStatementSyntax *syntax)

{
  TokenKind TVar1;
  logic_error *plVar2;
  string local_1c8;
  allocator<char> local_1a1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_180;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_160;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_140;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120;
  CaseStatementCheck local_100;
  undefined1 local_f9;
  CaseStatementCheck check;
  allocator<char> local_c1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  CaseStatementCondition local_1c;
  CaseStatementSyntax *pCStack_18;
  CaseStatementCondition condition;
  CaseStatementSyntax *syntax_local;
  
  TVar1 = (syntax->caseKeyword).kind;
  pCStack_18 = syntax;
  syntax_local = (CaseStatementSyntax *)this;
  if (TVar1 == CaseKeyword) {
    local_1c = Normal;
  }
  else if (TVar1 == CaseXKeyword) {
    local_1c = WildcardXOrZ;
  }
  else {
    if (TVar1 != CaseZKeyword) {
      local_f9 = 1;
      plVar2 = (logic_error *)__cxa_allocate_exception(0x10);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_c0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/ast/Statements.cpp"
                 ,&local_c1);
      std::operator+(&local_a0,&local_c0,":");
      std::__cxx11::to_string((string *)&check,0x3f0);
      std::operator+(&local_80,&local_a0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&check);
      std::operator+(&local_60,&local_80,": ");
      std::operator+(&local_40,&local_60,"Default case should be unreachable!");
      std::logic_error::logic_error(plVar2,(string *)&local_40);
      local_f9 = 0;
      __cxa_throw(plVar2,&std::logic_error::typeinfo,std::logic_error::~logic_error);
    }
    local_1c = WildcardJustZ;
  }
  TVar1 = (syntax->uniqueOrPriority).kind;
  if (TVar1 == Unknown) {
    local_100 = None;
  }
  else if (TVar1 == PriorityKeyword) {
    local_100 = Priority;
  }
  else if (TVar1 == UniqueKeyword) {
    local_100 = Unique;
  }
  else {
    if (TVar1 != Unique0Keyword) {
      plVar2 = (logic_error *)__cxa_allocate_exception(0x10);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1a0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/ast/Statements.cpp"
                 ,&local_1a1);
      std::operator+(&local_180,&local_1a0,":");
      std::__cxx11::to_string(&local_1c8,0x402);
      std::operator+(&local_160,&local_180,&local_1c8);
      std::operator+(&local_140,&local_160,": ");
      std::operator+(&local_120,&local_140,"Default case should be unreachable!");
      std::logic_error::logic_error(plVar2,(string *)&local_120);
      __cxa_throw(plVar2,&std::logic_error::typeinfo,std::logic_error::~logic_error);
    }
    local_100 = Unique0;
  }
  std::tuple<slang::ast::CaseStatementCondition,_slang::ast::CaseStatementCheck>::
  tuple<slang::ast::CaseStatementCondition_&,_slang::ast::CaseStatementCheck_&,_true>
            ((tuple<slang::ast::CaseStatementCondition,_slang::ast::CaseStatementCheck> *)this,
             &local_1c,&local_100);
  return (tuple<slang::ast::CaseStatementCondition,_slang::ast::CaseStatementCheck>)
         (_Tuple_impl<0UL,_slang::ast::CaseStatementCondition,_slang::ast::CaseStatementCheck>)this;
}

Assistant:

static std::tuple<CaseStatementCondition, CaseStatementCheck> getConditionAndCheck(
    const CaseStatementSyntax& syntax) {

    CaseStatementCondition condition;
    switch (syntax.caseKeyword.kind) {
        case TokenKind::CaseKeyword:
            condition = CaseStatementCondition::Normal;
            break;
        case TokenKind::CaseXKeyword:
            condition = CaseStatementCondition::WildcardXOrZ;
            break;
        case TokenKind::CaseZKeyword:
            condition = CaseStatementCondition::WildcardJustZ;
            break;
        default:
            ASSUME_UNREACHABLE;
    }

    CaseStatementCheck check;
    switch (syntax.uniqueOrPriority.kind) {
        case TokenKind::Unknown:
            check = CaseStatementCheck::None;
            break;
        case TokenKind::UniqueKeyword:
            check = CaseStatementCheck::Unique;
            break;
        case TokenKind::Unique0Keyword:
            check = CaseStatementCheck::Unique0;
            break;
        case TokenKind::PriorityKeyword:
            check = CaseStatementCheck::Priority;
            break;
        default:
            ASSUME_UNREACHABLE;
    }

    return {condition, check};
}